

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedTimeZone::countTransitionRules(RuleBasedTimeZone *this,UErrorCode *param_1)

{
  int32_t iVar1;
  int local_1c;
  int32_t count;
  UErrorCode *param_1_local;
  RuleBasedTimeZone *this_local;
  
  local_1c = 0;
  if (this->fHistoricRules != (UVector *)0x0) {
    local_1c = UVector::size(this->fHistoricRules);
  }
  if (this->fFinalRules != (UVector *)0x0) {
    iVar1 = UVector::size(this->fFinalRules);
    local_1c = iVar1 + local_1c;
  }
  return local_1c;
}

Assistant:

int32_t
RuleBasedTimeZone::countTransitionRules(UErrorCode& /*status*/) const {
    int32_t count = 0;
    if (fHistoricRules != NULL) {
        count += fHistoricRules->size();
    }
    if (fFinalRules != NULL) {
        count += fFinalRules->size();
    }
    return count;
}